

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  bool bVar1;
  uint uVar2;
  string *value;
  uint8 *puVar3;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  Type *pTVar4;
  MessageOptions *value_03;
  uint32 tag;
  
LAB_001f212d:
  puVar3 = input->buffer_;
  if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar3 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  uVar2 = tag & 7;
  switch(tag >> 3) {
  case 1:
    if (uVar2 != 2) break;
    value = mutable_name_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,value);
    if (!bVar1) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x12')) {
      do {
        input->buffer_ = puVar3 + 1;
LAB_001f222b:
        pTVar4 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(this->field_).super_RepeatedPtrFieldBase);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>(input,pTVar4);
        if (!bVar1) {
          return false;
        }
        puVar3 = input->buffer_;
        if (input->buffer_end_ <= puVar3) goto LAB_001f212d;
      } while (*puVar3 == '\x12');
      if (*puVar3 == '\x1a') {
        do {
          input->buffer_ = puVar3 + 1;
LAB_001f226b:
          value_00 = internal::RepeatedPtrFieldBase::
                     Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                               (&(this->nested_type_).super_RepeatedPtrFieldBase);
          bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::DescriptorProto>
                            (input,value_00);
          if (!bVar1) {
            return false;
          }
          puVar3 = input->buffer_;
          if (input->buffer_end_ <= puVar3) goto LAB_001f212d;
        } while (*puVar3 == '\x1a');
        if (*puVar3 == '\"') {
          do {
            input->buffer_ = puVar3 + 1;
LAB_001f22ab:
            value_01 = internal::RepeatedPtrFieldBase::
                       Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                                 (&(this->enum_type_).super_RepeatedPtrFieldBase);
            bVar1 = internal::WireFormatLite::
                    ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value_01);
            if (!bVar1) {
              return false;
            }
            puVar3 = input->buffer_;
            if (input->buffer_end_ <= puVar3) goto LAB_001f212d;
          } while (*puVar3 == '\"');
          if (*puVar3 == '*') {
            do {
              input->buffer_ = puVar3 + 1;
LAB_001f22eb:
              value_02 = internal::RepeatedPtrFieldBase::
                         Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                                   (&(this->extension_range_).super_RepeatedPtrFieldBase);
              bVar1 = internal::WireFormatLite::
                      ReadMessageNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>
                                (input,value_02);
              if (!bVar1) {
                return false;
              }
              puVar3 = input->buffer_;
              if (input->buffer_end_ <= puVar3) goto LAB_001f212d;
            } while (*puVar3 == '*');
            if (*puVar3 == '2') {
              do {
                input->buffer_ = puVar3 + 1;
LAB_001f232b:
                pTVar4 = internal::RepeatedPtrFieldBase::
                         Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                                   (&(this->extension_).super_RepeatedPtrFieldBase);
                bVar1 = internal::WireFormatLite::
                        ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>(input,pTVar4);
                if (!bVar1) {
                  return false;
                }
                puVar3 = input->buffer_;
                if (input->buffer_end_ <= puVar3) goto LAB_001f212d;
              } while (*puVar3 == '2');
              if (*puVar3 == ':') {
                input->buffer_ = puVar3 + 1;
LAB_001f2365:
                value_03 = mutable_options(this);
                bVar1 = internal::WireFormatLite::
                        ReadMessageNoVirtual<google::protobuf::MessageOptions>(input,value_03);
                if (!bVar1) {
                  return false;
                }
                bVar1 = io::CodedInputStream::ExpectAtEnd(input);
                if (bVar1) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
    goto LAB_001f212d;
  case 2:
    if (uVar2 == 2) goto LAB_001f222b;
    break;
  case 3:
    if (uVar2 == 2) goto LAB_001f226b;
    break;
  case 4:
    if (uVar2 == 2) goto LAB_001f22ab;
    break;
  case 5:
    if (uVar2 == 2) goto LAB_001f22eb;
    break;
  case 6:
    if (uVar2 == 2) goto LAB_001f232b;
    break;
  case 7:
    if (uVar2 == 2) goto LAB_001f2365;
  }
  if (uVar2 == 4) {
    return true;
  }
  bVar1 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
  if (!bVar1) {
    return false;
  }
  goto LAB_001f212d;
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_field:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        if (input->ExpectTag(26)) goto parse_nested_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_nested_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_nested_type;
        if (input->ExpectTag(34)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_enum_type;
        if (input->ExpectTag(42)) goto parse_extension_range;
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension_range:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_extension_range;
        if (input->ExpectTag(50)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_extension;
        if (input->ExpectTag(58)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}